

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalid_PredictedFeatureName(void)

{
  bool bVar1;
  NeuralNetwork *this;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  DictionaryFeatureType *this_00;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar4;
  ostream *poVar5;
  Result local_230;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInputTarget;
  ArrayFeatureType *pAStack_1f0;
  int i;
  ArrayFeatureType *outTensorShape;
  FeatureDescription *outTensor;
  Result local_1d8;
  FeatureDescription *trainingInput;
  _Rb_tree_node_base _Stack_1a0;
  size_t sStack_180;
  set<long,_std::less<long>,_std::allocator<long>_> local_178;
  set<long,_std::less<long>,_std::allocator<long>_> local_148;
  CategoricalCrossEntropyLossLayer *local_118;
  CategoricalCrossEntropyLossLayer *ceLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  FeatureDescription *outputProbs;
  FeatureDescription *output;
  undefined1 local_e8 [8];
  string probsName;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_57e1f;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_57e36;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)(local_68 + 0x28),true,(TensorAttributes *)&tensorAttributesOut.dimension,
             (TensorAttributes *)&neuralNet,0x400,false,false);
  CoreML::Specification::Model::set_specificationversion((Model *)(local_68 + 0x28),4);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)(local_68 + 0x28));
  addSoftmaxLayer((Model *)(local_68 + 0x28),"softmax","OutTensor","softmax_out");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&probsName._M_storage,"predictedFeatures",
             (allocator *)((long)&probsName.super__Rb_tree_node_base._M_right + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&probsName.super__Rb_tree_node_base._M_right + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_e8,"probs",(allocator *)((long)&output + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&output + 7));
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  outputProbs = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(outputProbs,(string *)&probsName._M_storage);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(outputProbs);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar3);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  updateParams = (NetworkUpdateParameters *)
                 CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)updateParams,(string *)local_e8);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)updateParams);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)updateParams);
  this_00 = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar3);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this_00);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::set_predictedfeaturename
            (pMVar2,(string *)&probsName._M_storage);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname(pMVar2,(string *)local_e8)
  ;
  lossLayer = (LossLayer *)CoreML::Specification::NeuralNetwork::mutable_updateparams(this);
  ceLossLayer = (CategoricalCrossEntropyLossLayer *)
                CoreML::Specification::NetworkUpdateParameters::add_losslayers
                          ((NetworkUpdateParameters *)lossLayer);
  CoreML::Specification::LossLayer::set_name((LossLayer *)ceLossLayer,"cross_entropy_loss_layer");
  local_118 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer
                        ((LossLayer *)ceLossLayer);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(local_118,"softmax_out");
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(local_118,"target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (this,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_148._M_t._M_impl._0_8_ = 0;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_148);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(this,kSgdOptimizer,10,5,100,&local_148);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_148);
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_178._M_t._M_impl._0_8_ = 0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_178);
  addEpochs<CoreML::Specification::NeuralNetwork>(this,100,1,100,&local_178);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_178);
  _Stack_1a0._M_right = (_Base_ptr)0x0;
  sStack_180 = 0;
  _Stack_1a0._M_parent = (_Base_ptr)0x0;
  _Stack_1a0._M_left = (_Base_ptr)0x0;
  trainingInput = (FeatureDescription *)0x0;
  _Stack_1a0._M_color = _S_red;
  _Stack_1a0._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (this,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput)
  ;
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  local_1d8.m_message._M_storage._M_storage =
       (uchar  [8])
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)local_1d8.m_message._M_storage._M_storage,
             (string *)&probsName._M_storage);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)local_1d8.m_message._M_storage._M_storage);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar3);
  CoreML::Model::validate(&local_1d8,(Model *)(local_68 + 0x28));
  CoreML::Result::operator=((Result *)local_68,&local_1d8);
  CoreML::Result::~Result(&local_1d8);
  bVar1 = CoreML::Result::good((Result *)local_68);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x76d);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  else {
    pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    CoreML::Specification::ModelDescription::clear_output(pMVar2);
    pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    outTensorShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar2)
    ;
    CoreML::Specification::FeatureDescription::set_name
              ((FeatureDescription *)outTensorShape,(char *)neuralNet);
    pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                       ((FeatureDescription *)outTensorShape);
    pAStack_1f0 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
    CoreML::Specification::ArrayFeatureType::set_datatype
              (pAStack_1f0,ArrayFeatureType_ArrayDataType_FLOAT32);
    for (trainingInputTarget._4_4_ = 0; trainingInputTarget._4_4_ < (int)tensorAttributesOut.name;
        trainingInputTarget._4_4_ = trainingInputTarget._4_4_ + 1) {
      CoreML::Specification::ArrayFeatureType::add_shape(pAStack_1f0,1);
    }
    pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
    trainingInputTensorShape =
         (ArrayFeatureType *)
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
    CoreML::Specification::FeatureDescription::set_name
              ((FeatureDescription *)trainingInputTensorShape,"target");
    pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                       ((FeatureDescription *)trainingInputTensorShape);
    local_230.m_message._M_storage._M_storage =
         (uchar  [8])CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
    CoreML::Specification::ArrayFeatureType::set_datatype
              ((ArrayFeatureType *)local_230.m_message._M_storage._M_storage,
               ArrayFeatureType_ArrayDataType_INT32);
    CoreML::Specification::ArrayFeatureType::add_shape
              ((ArrayFeatureType *)local_230.m_message._M_storage._M_storage,1);
    CoreML::Model::validate(&local_230,(Model *)(local_68 + 0x28));
    CoreML::Result::operator=((Result *)local_68,&local_230);
    CoreML::Result::~Result(&local_230);
    bVar1 = CoreML::Result::good((Result *)local_68);
    if (bVar1) {
      spec._oneof_case_[0] = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x781);
      poVar5 = std::operator<<(poVar5,": error: ");
      poVar5 = std::operator<<(poVar5,"(res).good()");
      poVar5 = std::operator<<(poVar5," was false, expected true.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  outTensor._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)&probsName._M_storage);
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testInvalid_PredictedFeatureName() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    // Model is not a classifier
    std::string predictedFeatureName = "predictedFeatures";
    std::string probsName = "probs";
    auto *output = spec.mutable_description()->add_output();
    output->set_name(predictedFeatureName);
    output->mutable_type()->mutable_stringtype();

    auto *outputProbs = spec.mutable_description()->add_output();
    outputProbs->set_name(probsName);
    outputProbs->mutable_type()->mutable_dictionarytype();
    outputProbs->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    spec.mutable_description()->set_predictedfeaturename(predictedFeatureName);
    spec.mutable_description()->set_predictedprobabilitiesname(probsName);


    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cross_entropy_loss_layer");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("softmax_out");
    ceLossLayer->set_target("target");

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Model inputs should be added, now we'll add the predicted feature name (which really exists in the model) as a training input, should fail as it's not a classifier
    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(predictedFeatureName);
    trainingInput->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Remove predictedFeatureName from model's outputs and add target to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}